

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_rep(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  int32_t rep;
  GCstr *s2;
  GCstr *s1;
  GCstr *pGVar3;
  SBuf *pSVar4;
  ulong uVar5;
  
  s2 = lj_lib_checkstr(L,1);
  rep = lj_lib_checkint(L,2);
  s1 = lj_lib_optstr(L,3);
  uVar5 = (ulong)(L->glref).ptr32;
  *(int *)(uVar5 + 0xf4) = (int)L;
  *(undefined4 *)(uVar5 + 0xe8) = *(undefined4 *)(uVar5 + 0xf0);
  pGVar3 = s2;
  if (1 < rep && s1 != (GCstr *)0x0) {
    pGVar3 = lj_buf_cat2str(L,s1,s2);
    *(undefined4 *)(uVar5 + 0xe8) = *(undefined4 *)(uVar5 + 0xf0);
    lj_buf_putstr((SBuf *)(uVar5 + 0xe8),s2);
    rep = rep + -1;
  }
  pSVar4 = lj_buf_putstr_rep((SBuf *)(uVar5 + 0xe8),pGVar3,rep);
  pTVar2 = L->top;
  uVar1 = (pSVar4->b).ptr32;
  pGVar3 = lj_str_new(L,(char *)(ulong)uVar1,(ulong)((pSVar4->p).ptr32 - uVar1));
  pTVar2[-1].u32.lo = (uint32_t)pGVar3;
  *(undefined4 *)((long)pTVar2 + -4) = 0xfffffffb;
  uVar5 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar5 + 0x54) <= *(uint *)(uVar5 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_rep)		LJLIB_REC(.)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t rep = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  SBuf *sb = lj_buf_tmp_(L);
  if (sep && rep > 1) {
    GCstr *s2 = lj_buf_cat2str(L, sep, s);
    lj_buf_reset(sb);
    lj_buf_putstr(sb, s);
    s = s2;
    rep--;
  }
  sb = lj_buf_putstr_rep(sb, s, rep);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}